

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_filesystem_dirtier.cc
# Opt level: O0

void __thiscall PeriodicFilesystemDirtier::Tick(PeriodicFilesystemDirtier *this)

{
  bool bVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  time_point now;
  PeriodicFilesystemDirtier *this_local;
  
  now.__d.__r = (duration)(duration)this;
  local_18.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  bVar1 = std::chrono::operator>=(&local_18,&this->next_cycle_);
  if (bVar1) {
    FilesystemDirt::AddDirtyPath(this->filesystem_dirt_,&this->path_);
    tVar2 = std::chrono::operator+(&local_18,&this->interval_);
    (this->next_cycle_).__d.__r = (rep)tVar2.__d.__r;
  }
  return;
}

Assistant:

void PeriodicFilesystemDirtier::Tick() {
  auto now = std::chrono::steady_clock::now();
  if (now >= next_cycle_) {
    filesystem_dirt_->AddDirtyPath(path_);
    next_cycle_ = now + interval_;
  }
}